

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::StatsdPullAtomConfig::StatsdPullAtomConfig
          (StatsdPullAtomConfig *this,StatsdPullAtomConfig *param_1)

{
  pointer pcVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__StatsdPullAtomConfig_003a17a8;
  std::vector<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>::vector
            (&this->pull_atom_id_,&param_1->pull_atom_id_);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->raw_pull_atom_id_,&param_1->raw_pull_atom_id_);
  this->pull_frequency_ms_ = param_1->pull_frequency_ms_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->packages_,&param_1->packages_);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  pcVar1 = (param_1->unknown_fields_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->unknown_fields_,pcVar1,
             pcVar1 + (param_1->unknown_fields_)._M_string_length);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

StatsdPullAtomConfig::StatsdPullAtomConfig(const StatsdPullAtomConfig&) = default;